

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

void prepare_default_pairs(vrna_md_t *md)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  uint local_18;
  uint local_14;
  uint j;
  uint i;
  vrna_md_t *md_local;
  
  for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
    md->alias[local_14] = (short)local_14;
  }
  md->alias[5] = 3;
  md->alias[6] = 2;
  md->alias[7] = 0;
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
      md->pair[local_14][local_18] = BP_pair[local_14][local_18];
    }
  }
  if (md->noGU != 0) {
    md->pair[4][3] = 0;
    md->pair[3][4] = 0;
  }
  if (md->nonstandards[0] != '\0') {
    for (local_14 = 0; sVar3 = strlen(md->nonstandards), local_14 < sVar3; local_14 = local_14 + 2)
    {
      iVar1 = vrna_nucleotide_encode(md->nonstandards[local_14],md);
      iVar2 = vrna_nucleotide_encode(md->nonstandards[local_14 + 1],md);
      md->pair[iVar1][iVar2] = 7;
    }
  }
  return;
}

Assistant:

PRIVATE void
prepare_default_pairs(vrna_md_t *md)
{
  unsigned int i, j;

  for (i = 0; i < 5; i++)
    md->alias[i] = (short)i;

  md->alias[5]  = 3;          /* X <-> G */
  md->alias[6]  = 2;          /* K <-> C */
  md->alias[7]  = 0;          /* I <-> default base '@' */

  for (i = 0; i < NBASES; i++)
    for (j = 0; j < NBASES; j++)
      md->pair[i][j] = BP_pair[i][j];

  if (md->noGU)
    md->pair[3][4] = md->pair[4][3] = 0;

  if (md->nonstandards[0] != '\0') {
    /* allow nonstandard bp's (encoded by type=7) */
    for (i = 0; i < strlen(md->nonstandards); i += 2)
      md->pair[vrna_nucleotide_encode(md->nonstandards[i], md)]
      [vrna_nucleotide_encode(md->nonstandards[i + 1], md)] = 7;
  }
}